

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O1

int db_gethook(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  lua_State *L_00;
  lua_Hook p_Var4;
  ulong uVar5;
  bool bVar6;
  char buff [5];
  int arg;
  char local_21 [5];
  int local_1c;
  
  L_00 = getthread(L,&local_1c);
  uVar1 = lua_gethookmask(L_00);
  p_Var4 = lua_gethook(L_00);
  if (p_Var4 == (lua_Hook)0x0) {
    lua_pushnil(L);
  }
  else if (p_Var4 == hookf) {
    lua_rawgetp(L,-0xf4628,&HOOKKEY);
    checkstack(L,L_00,1);
    lua_pushthread(L_00);
    lua_xmove(L_00,L,1);
    lua_rawget(L,-2);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
  }
  else {
    lua_pushstring(L,"external hook");
  }
  bVar6 = (uVar1 & 1) != 0;
  if (bVar6) {
    local_21[0] = 'c';
  }
  uVar2 = (uint)bVar6;
  if ((uVar1 & 2) != 0) {
    uVar5 = (ulong)uVar2;
    uVar2 = uVar2 + 1;
    local_21[uVar5] = 'r';
  }
  if ((uVar1 & 4) != 0) {
    uVar5 = (ulong)uVar2;
    uVar2 = uVar2 + 1;
    local_21[uVar5] = 'l';
  }
  local_21[uVar2] = '\0';
  lua_pushstring(L,local_21);
  iVar3 = lua_gethookcount(L_00);
  lua_pushinteger(L,(long)iVar3);
  return 3;
}

Assistant:

static int db_gethook(lua_State *L) {
    int arg;
    lua_State *L1 = getthread(L, &arg);
    char buff[5];
    int mask = lua_gethookmask(L1);
    lua_Hook hook = lua_gethook(L1);
    if (hook == NULL)  /* no hook? */
        lua_pushnil(L);
    else if (hook != hookf)  /* external hook? */
        lua_pushliteral(L, "external hook");
    else {  /* hook table must exist */
        lua_rawgetp(L, LUA_REGISTRYINDEX, &HOOKKEY);
        checkstack(L, L1, 1);
        lua_pushthread(L1);
        lua_xmove(L1, L, 1);
        lua_rawget(L, -2);   /* 1st result = hooktable[L1] */
        lua_remove(L, -2);  /* remove hook table */
    }
    lua_pushstring(L, unmakemask(mask, buff));  /* 2nd result = mask */
    lua_pushinteger(L, lua_gethookcount(L1));  /* 3rd result = count */
    return 3;
}